

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_image *
rf_generate_ttf_font_atlas
          (rf_image *__return_storage_ptr__,rf_ttf_font_info *font_info,int atlas_width,int padding,
          rf_glyph_info *glyphs,rf_int glyphs_count,rf_font_antialias antialias,unsigned_short *dst,
          rf_int dst_count,rf_allocator temp_allocator)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  rf_source_location rVar4;
  rf_source_location rVar5;
  rf_allocator_args rVar6;
  undefined1 auVar7 [24];
  undefined8 *puVar8;
  stbtt_vertex *psVar9;
  stbtt_fontinfo *info;
  int iVar10;
  uint uVar11;
  int iVar12;
  stbtt__active_edge *z;
  float *pfVar13;
  stbtt__point *points;
  ulong uVar14;
  stbtt__edge *p_00;
  char **scanline;
  ulong uVar15;
  char **ppcVar16;
  stbtt__active_edge *psVar17;
  char **ppcVar18;
  undefined4 in_register_0000000c;
  rf_int rVar19;
  long lVar20;
  stbtt__active_edge *psVar21;
  stbtt__active_edge *psVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  rf_glyph_info *prVar26;
  uint uVar27;
  undefined8 *puVar28;
  stbtt__edge *psVar29;
  long lVar30;
  byte bVar31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  stbtt__active_edge *psVar35;
  uint uVar36;
  void *p;
  long *in_FS_OFFSET;
  bool bVar37;
  bool bVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float in_XMM2_Da;
  float fVar42;
  float in_XMM3_Da;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  int num_points;
  float y0;
  float scale;
  stbtt__active_edge *active;
  int iy0;
  int ix0;
  stbtt_vertex *vertices;
  stbtt_fontinfo *stbtt_ctx;
  float scanline_data [129];
  int local_4a4;
  ulong local_4a0;
  float local_494;
  float local_490;
  int local_48c;
  stbtt__active_edge *local_488;
  char *pcStack_480;
  ulong local_478;
  ulong local_470;
  int local_464;
  undefined8 *local_460;
  stbtt__active_edge *local_458;
  char **local_450;
  char *pcStack_448;
  ulong local_440;
  int local_438;
  float local_434;
  stbtt__point *local_430;
  char **local_428;
  int local_41c;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  stbtt__point *local_3f0;
  char *pcStack_3e8;
  ulong local_3e0;
  rf_ttf_font_info *local_3d8;
  rf_glyph_info *local_3d0;
  float *local_3c8;
  stbtt__edge *local_3c0;
  stbtt__active_edge local_3b8;
  int local_398;
  int local_394;
  float local_390;
  float local_38c;
  uint local_388;
  int local_384;
  char *local_380;
  char *pcStack_378;
  ulong local_370;
  stbtt__point *local_368;
  char *pcStack_360;
  ulong local_358;
  char *local_350;
  char *pcStack_348;
  ulong local_340;
  rf_image *local_338;
  rf_int local_330;
  undefined8 local_328;
  ulong local_320;
  void *local_318;
  ulong local_310;
  float *local_308;
  stbtt_vertex *local_300;
  undefined1 local_2f8 [16];
  ulong local_2e8;
  long local_2e0;
  stbtt_fontinfo *local_2d8;
  long local_2d0;
  long local_2c8;
  size_t local_2c0;
  size_t local_2b8;
  long local_2b0;
  ulong local_2a8;
  stbtt__active_edge *local_2a0;
  void *local_298;
  undefined8 uStack_290;
  undefined4 local_288;
  uint uStack_284;
  char *local_280;
  char *pcStack_278;
  undefined8 local_270;
  undefined8 local_268;
  ulong uStack_260;
  undefined4 local_258;
  uint uStack_254;
  char *local_250;
  char *pcStack_248;
  undefined8 local_240;
  char *local_238;
  char *pcStack_230;
  undefined8 local_228;
  
  local_328 = CONCAT44(in_register_0000000c,padding);
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (((font_info != (rf_ttf_font_info *)0x0) && (font_info->valid == true)) &&
     ((long)(ulong)(uint)(atlas_width * atlas_width) <= dst_count && dst != (unsigned_short *)0x0))
  {
    uVar15 = 0;
    local_3d8 = font_info;
    local_3d0 = glyphs;
    local_338 = __return_storage_ptr__;
    memset(dst,0,(ulong)(uint)(atlas_width * atlas_width * 2));
    if (0 < glyphs_count) {
      pfVar13 = &(local_3d0->field_0).rec.height;
      rVar19 = glyphs_count;
      uVar14 = uVar15;
      do {
        uVar15 = (ulong)(uint)(int)(pfVar13[-1] * *pfVar13);
        if ((int)(pfVar13[-1] * *pfVar13) < (int)uVar14) {
          uVar15 = uVar14;
        }
        pfVar13 = pfVar13 + 8;
        rVar19 = rVar19 + -1;
        uVar14 = uVar15;
      } while (rVar19 != 0);
    }
    local_250 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_248 = "rf_generate_ttf_font_atlas";
    local_240 = 0x5bc7;
    local_268 = 0;
    local_258 = 0;
    rVar4.proc_name._0_4_ = 0x17d59b;
    rVar4.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar4.proc_name._4_4_ = 0;
    rVar4.line_in_file = 0x5bc7;
    auVar7._8_8_ = (ulong)uStack_254 << 0x20;
    auVar7._0_8_ = uVar15;
    auVar7._16_8_ = 0;
    uStack_260 = uVar15;
    local_298 = (*temp_allocator.allocator_proc)
                          (&temp_allocator,rVar4,RF_AM_ALLOC,(rf_allocator_args)(auVar7 << 0x40));
    if (local_298 != (void *)0x0) {
      puVar28 = (undefined8 *)(*in_FS_OFFSET + -0x430);
      in_FS_OFFSET[-0x86] = (long)temp_allocator.user_data;
      in_FS_OFFSET[-0x85] = (long)temp_allocator.allocator_proc;
      if (0 < glyphs_count) {
        local_3b8.ey = (float)((int)local_328 * 2);
        local_2d8 = (stbtt_fontinfo *)&local_3d8->internal_stb_font_info;
        local_3b8.sy = (float)atlas_width;
        local_2e8 = (ulong)(uint)atlas_width;
        local_2e0 = local_2e8 << 0x20;
        local_464 = 2;
        iVar10 = 2;
        lVar20 = 0;
        prVar26 = local_3d0;
        local_460 = puVar28;
        local_398 = atlas_width;
        local_330 = glyphs_count;
        local_318 = local_298;
        do {
          info = local_2d8;
          local_2d0 = lVar20 * 0x20;
          uVar27 = (uint)prVar26[lVar20].field_0.rec.width;
          uVar36 = (uint)prVar26[lVar20].field_0.rec.height;
          uVar15 = (ulong)uVar36;
          local_418 = ZEXT416((uint)local_3d8->scale_factor);
          local_41c = iVar10;
          local_2c8 = lVar20;
          iVar10 = stbtt_FindGlyphIndex(local_2d8,prVar26[lVar20].codepoint);
          uVar11 = stbtt_GetGlyphShape(info,iVar10,&local_300);
          stbtt_GetGlyphBitmapBoxSubpixel
                    (info,iVar10,(float)local_418._0_4_,(float)local_418._0_4_,in_XMM2_Da,in_XMM3_Da
                     ,&local_384,(int *)&local_388,(int *)0x0,(int *)0x0);
          psVar9 = local_300;
          local_310 = uVar15;
          if (uVar36 != 0 && uVar27 != 0) {
            local_408._0_4_ = local_384;
            local_320 = (ulong)local_388;
            local_4a4 = 0;
            if ((int)uVar11 < 1) {
              uVar15 = 0;
            }
            else {
              lVar20 = 0;
              uVar15 = 0;
              do {
                uVar15 = (ulong)((int)uVar15 + (uint)((&local_300->type)[lVar20] == '\x01'));
                lVar20 = lVar20 + 0xe;
              } while ((ulong)uVar11 * 0xe != lVar20);
            }
            if ((int)uVar15 == 0) {
LAB_0013523d:
              points = (stbtt__point *)0x0;
              psVar35 = (stbtt__active_edge *)0x0;
            }
            else {
              local_238 = 
              "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
              ;
              pcStack_230 = "stbtt_FlattenCurves";
              local_228 = 0x55ac;
              local_488 = (stbtt__active_edge *)0x0;
              pcStack_480 = (char *)((long)(int)uVar15 << 2);
              local_478 = local_478 & 0xffffffff00000000;
              local_458 = (stbtt__active_edge *)(*(code *)in_FS_OFFSET[-0x85])(local_460,1);
              if (local_458 == (stbtt__active_edge *)0x0) {
                points = (stbtt__point *)0x0;
                psVar35 = local_458;
                uVar15 = 0;
              }
              else {
                local_490 = (0.35 / (float)local_418._0_4_) * (0.35 / (float)local_418._0_4_);
                uVar14 = 0;
                iVar10 = 0;
                points = (stbtt__point *)0x0;
                local_4a0 = uVar15;
                do {
                  if ((int)uVar14 == 0) {
LAB_00134f18:
                    local_4a4 = 0;
                    if ((int)uVar11 < 1) {
                      lVar20 = -1;
                    }
                    else {
                      uVar36 = 0xffffffff;
                      fVar41 = 0.0;
                      lVar20 = 0;
                      fVar39 = 0.0;
                      local_470 = uVar14;
                      local_430 = points;
                      do {
                        iVar12 = local_4a4;
                        iVar32 = local_4a4;
                        switch((&psVar9->type)[lVar20]) {
                        case '\x01':
                          if (-1 < (int)uVar36) {
                            *(int *)((long)&local_458->next + (ulong)uVar36 * 4) =
                                 local_4a4 - iVar10;
                          }
                          uVar36 = uVar36 + 1;
                          sVar2 = *(short *)((long)&psVar9->x + lVar20);
                          sVar3 = *(short *)((long)&psVar9->y + lVar20);
                          iVar10 = local_4a4;
                          break;
                        case '\x02':
                          sVar2 = *(short *)((long)&psVar9->x + lVar20);
                          sVar3 = *(short *)((long)&psVar9->y + lVar20);
                          break;
                        case '\x03':
                          stbtt__tesselate_curve
                                    (points,&local_4a4,fVar39,fVar41,
                                     (float)(int)*(short *)((long)&psVar9->cx + lVar20),
                                     (float)(int)*(short *)((long)&psVar9->cy + lVar20),
                                     (float)(int)*(short *)((long)&psVar9->x + lVar20),
                                     (float)(int)*(short *)((long)&psVar9->y + lVar20),local_490,0);
                          goto LAB_00135062;
                        case '\x04':
                          stbtt__tesselate_cubic
                                    (points,&local_4a4,fVar39,fVar41,
                                     (float)(int)*(short *)((long)&psVar9->cx + lVar20),
                                     (float)(int)*(short *)((long)&psVar9->cy + lVar20),
                                     (float)(int)*(short *)((long)&psVar9->cx1 + lVar20),
                                     (float)(int)*(short *)((long)&psVar9->cy1 + lVar20),
                                     (float)(int)*(short *)((long)&psVar9->x + lVar20),
                                     (float)(int)*(short *)((long)&psVar9->y + lVar20),local_490,0);
LAB_00135062:
                          fVar39 = (float)(int)*(short *)((long)&psVar9->x + lVar20);
                          fVar41 = (float)(int)*(short *)((long)&psVar9->y + lVar20);
                          points = local_430;
                          iVar32 = local_4a4;
                        default:
                          goto switchD_00134f62_default;
                        }
                        fVar41 = (float)(int)sVar3;
                        fVar39 = (float)(int)sVar2;
                        iVar32 = local_4a4 + 1;
                        if (points != (stbtt__point *)0x0) {
                          local_4a4 = local_4a4 + 1;
                          points[iVar12].x = fVar39;
                          points[iVar12].y = fVar41;
                          iVar32 = local_4a4;
                        }
switchD_00134f62_default:
                        local_4a4 = iVar32;
                        lVar20 = lVar20 + 0xe;
                      } while ((ulong)uVar11 * 0xe != lVar20);
                      lVar20 = (long)(int)uVar36;
                      uVar14 = local_470;
                    }
                    *(int *)((long)&local_458->next + lVar20 * 4) = local_4a4 - iVar10;
                    bVar37 = true;
                  }
                  else {
                    local_450 = (char **)0x17c440;
                    pcStack_448 = "stbtt_FlattenCurves";
                    local_440 = 0x55b7;
                    local_3f0 = (stbtt__point *)0x0;
                    pcStack_3e8 = (char *)((long)local_4a4 << 3);
                    local_3e0 = local_3e0 & 0xffffffff00000000;
                    points = (stbtt__point *)(*(code *)in_FS_OFFSET[-0x85])(local_460,1);
                    if (points != (stbtt__point *)0x0) goto LAB_00134f18;
                    points = (stbtt__point *)0x0;
                    bVar37 = false;
                  }
                  puVar28 = local_460;
                  if (!bVar37) {
                    local_350 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                    ;
                    pcStack_348 = "stbtt_FlattenCurves";
                    local_340 = 0x55e2;
                    pcStack_360 = (char *)0x0;
                    local_358 = local_358 & 0xffffffff00000000;
                    local_368 = points;
                    (*(code *)in_FS_OFFSET[-0x85])(local_460,3);
                    local_380 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                    ;
                    pcStack_378 = "stbtt_FlattenCurves";
                    local_370 = 0x55e3;
                    local_3b8.next = local_458;
                    local_3b8.fx = 0.0;
                    local_3b8.fdx = 0.0;
                    local_3b8.fdy = 0.0;
                    uVar15 = 0;
                    (*(code *)in_FS_OFFSET[-0x85])(puVar28,3);
                    goto LAB_0013523d;
                  }
                  iVar12 = (int)uVar14;
                  uVar14 = (ulong)(iVar12 + 1);
                  psVar35 = local_458;
                  uVar15 = local_4a0;
                } while (iVar12 == 0);
              }
            }
            puVar28 = local_460;
            if (points != (stbtt__point *)0x0) {
              if ((int)uVar15 < 1) {
                pcStack_378 = (char *)0x14;
              }
              else {
                uVar14 = 0;
                lVar20 = 0;
                do {
                  lVar20 = (long)(int)lVar20 + (long)*(int *)((long)&psVar35->next + uVar14 * 4);
                  uVar14 = uVar14 + 1;
                } while ((uVar15 & 0xffffffff) != uVar14);
                pcStack_378 = (char *)(lVar20 * 0x14 + 0x14);
              }
              local_368 = (stbtt__point *)0x17c440;
              pcStack_360 = "stbtt__rasterize";
              local_358 = 0x552f;
              local_380 = (char *)0x0;
              local_370 = local_370 & 0xffffffff00000000;
              local_430 = points;
              p_00 = (stbtt__edge *)(*(code *)in_FS_OFFSET[-0x85])(local_460,1);
              local_3c0 = p_00;
              if (p_00 != (stbtt__edge *)0x0) {
                if ((int)uVar15 < 1) {
                  uVar11 = 0;
                }
                else {
                  uVar14 = 0;
                  uVar11 = 0;
                  iVar10 = 0;
                  do {
                    iVar12 = *(int *)((long)&psVar35->next + uVar14 * 4);
                    if (0 < iVar12) {
                      uVar34 = (ulong)(iVar12 - 1);
                      uVar24 = 0;
                      do {
                        iVar32 = (int)uVar34;
                        fVar39 = local_430[(long)iVar10 + (long)iVar32].y;
                        fVar41 = local_430[(long)iVar10 + uVar24].y;
                        if ((fVar39 != fVar41) || (NAN(fVar39) || NAN(fVar41))) {
                          iVar33 = (int)uVar24;
                          if (fVar39 <= fVar41) {
                            iVar33 = iVar32;
                            iVar32 = (int)uVar24;
                          }
                          p_00[(int)uVar11].invert = (uint)(fVar41 < fVar39);
                          p_00[(int)uVar11].x0 =
                               local_430[(long)iVar10 + (long)iVar32].x * (float)local_418._0_4_ +
                               0.0;
                          p_00[(int)uVar11].y0 =
                               local_430[(long)iVar10 + (long)iVar32].y * -(float)local_418._0_4_ +
                               0.0;
                          p_00[(int)uVar11].x1 =
                               local_430[(long)iVar10 + (long)iVar33].x * (float)local_418._0_4_ +
                               0.0;
                          p_00[(int)uVar11].y1 =
                               local_430[(long)iVar10 + (long)iVar33].y * -(float)local_418._0_4_ +
                               0.0;
                          uVar11 = uVar11 + 1;
                        }
                        uVar34 = uVar24 & 0xffffffff;
                        uVar24 = uVar24 + 1;
                      } while ((long)uVar24 < (long)*(int *)((long)&psVar35->next + uVar14 * 4));
                    }
                    iVar10 = iVar10 + iVar12;
                    uVar14 = uVar14 + 1;
                  } while (uVar14 != (uVar15 & 0xffffffff));
                }
                local_458 = psVar35;
                stbtt__sort_edges_quicksort(p_00,uVar11);
                uVar15 = local_320;
                if (1 < (int)uVar11) {
                  uVar14 = 1;
                  do {
                    fVar39 = p_00[uVar14].x0;
                    fVar41 = p_00[uVar14].y0;
                    iVar10 = p_00[uVar14].invert;
                    pcStack_230 = (char *)CONCAT44(pcStack_230._4_4_,iVar10);
                    local_238 = *(char **)&p_00[uVar14].x1;
                    uVar24 = uVar14 & 0xffffffff;
                    do {
                      uVar36 = (uint)uVar24;
                      if ((int)uVar36 < 1) break;
                      fVar42 = p_00[uVar24 - 1].y0;
                      if (fVar41 < fVar42) {
                        psVar29 = p_00 + uVar24;
                        psVar29->invert = psVar29[-1].invert;
                        fVar47 = psVar29[-1].y0;
                        fVar43 = psVar29[-1].x1;
                        fVar46 = psVar29[-1].y1;
                        psVar29->x0 = psVar29[-1].x0;
                        psVar29->y0 = fVar47;
                        psVar29->x1 = fVar43;
                        psVar29->y1 = fVar46;
                        uVar24 = (ulong)(uVar36 - 1);
                      }
                      uVar36 = (uint)uVar24;
                    } while (fVar41 < fVar42);
                    if (uVar14 != uVar36) {
                      p_00[(int)uVar36].x0 = fVar39;
                      p_00[(int)uVar36].y0 = fVar41;
                      *(char **)&p_00[(int)uVar36].x1 = local_238;
                      p_00[(int)uVar36].invert = iVar10;
                    }
                    uVar14 = uVar14 + 1;
                  } while (uVar14 != uVar11);
                }
                local_3b8.next = (stbtt__active_edge *)0x0;
                scanline = &local_238;
                if (0x40 < (int)uVar27) {
                  local_3f0 = (stbtt__point *)0x17c440;
                  pcStack_3e8 = "stbtt__rasterize_sorted_edges";
                  local_3e0 = 0x5465;
                  local_350 = (char *)0x0;
                  pcStack_348 = (char *)((ulong)uVar27 * 8 + 4);
                  local_340 = local_340 & 0xffffffff00000000;
                  scanline = (char **)(*(code *)in_FS_OFFSET[-0x85])(local_460);
                }
                p_00[(int)uVar11].y0 = (float)((int)uVar15 + (int)local_310) + 1.0;
                if ((int)local_310 < 1) {
                  local_428 = (char **)0x0;
                  puVar8 = local_460;
                  ppcVar18 = local_450;
                  ppcVar16 = local_428;
                }
                else {
                  local_2b0 = (long)(int)uVar27;
                  local_3c8 = (float *)((long)scanline + local_2b0 * 4);
                  local_390 = (float)(int)local_408._0_4_;
                  local_308 = local_3c8 + 1;
                  local_2b8 = local_2b0 * 4;
                  local_434 = (float)(int)uVar27;
                  local_2c0 = local_2b0 * 4 + 4;
                  uVar15 = uVar15 & 0xffffffff;
                  uVar14 = 0;
                  local_438 = 0;
                  local_428 = (char **)0x0;
                  local_48c = 0;
                  psVar35 = (stbtt__active_edge *)0x0;
                  do {
                    local_394 = (int)uVar15;
                    local_494 = (float)local_394;
                    local_4a0 = CONCAT44(local_4a0._4_4_,local_494 + 1.0);
                    memset(scanline,0,local_2b8);
                    memset(local_3c8,0,local_2c0);
                    if (local_3b8.next != (stbtt__active_edge *)0x0) {
                      psVar17 = local_3b8.next;
                      psVar21 = &local_3b8;
                      do {
                        psVar22 = psVar17;
                        if (psVar17->ey <= local_494) {
                          psVar21->next = psVar17->next;
                          psVar17->direction = 0.0;
                          psVar17->next = psVar35;
                          psVar22 = psVar21;
                          psVar35 = psVar17;
                        }
                        psVar17 = psVar22->next;
                        psVar21 = psVar22;
                      } while (psVar17 != (stbtt__active_edge *)0x0);
                    }
                    local_2a8 = uVar14;
                    fVar39 = p_00->y0;
                    ppcVar16 = local_428;
                    fVar41 = local_494;
                    if (fVar39 <= (float)local_4a0) {
                      bVar37 = (int)local_320 != 0;
                      bVar38 = local_438 == 0;
                      do {
                        if ((fVar39 != p_00->y1) || (NAN(fVar39) || NAN(p_00->y1))) {
                          if (psVar35 == (stbtt__active_edge *)0x0) {
                            psVar17 = psVar35;
                            if (local_48c == 0) {
                              local_488 = (stbtt__active_edge *)0x17c440;
                              pcStack_480 = "stbtt__hheap_alloc";
                              local_478 = 0x529c;
                              local_450 = (char **)0x0;
                              pcStack_448 = (char *)0x6408;
                              local_440 = local_440 & 0xffffffff00000000;
                              ppcVar18 = (char **)(*(code *)in_FS_OFFSET[-0x85])(local_460,1);
                              fVar41 = local_494;
                              if (ppcVar18 == (char **)0x0) {
                                psVar21 = (stbtt__active_edge *)0x0;
                                goto LAB_00135e67;
                              }
                              *ppcVar18 = (char *)ppcVar16;
                              local_48c = 800;
                              ppcVar16 = ppcVar18;
                            }
                            lVar20 = (long)local_48c;
                            local_48c = local_48c + -1;
                            psVar21 = (stbtt__active_edge *)(ppcVar16 + lVar20 * 4 + -3);
                          }
                          else {
                            psVar17 = psVar35->next;
                            psVar21 = psVar35;
                          }
LAB_00135e67:
                          psVar35 = psVar17;
                          if (psVar21 != (stbtt__active_edge *)0x0) {
                            fVar39 = p_00->x0;
                            fVar42 = p_00->y0;
                            fVar47 = p_00->y1;
                            fVar43 = (p_00->x1 - fVar39) / (fVar47 - fVar42);
                            psVar21->fdx = fVar43;
                            psVar21->fdy = (float)(-(uint)(fVar43 != 0.0) & (uint)(1.0 / fVar43));
                            psVar21->fx = ((fVar41 - fVar42) * fVar43 + fVar39) - local_390;
                            psVar21->direction =
                                 *(float *)(&DAT_00179a68 + (ulong)(p_00->invert == 0) * 4);
                            psVar21->sy = fVar42;
                            psVar21->ey = fVar47;
                            psVar21->next = (stbtt__active_edge *)0x0;
                            if (fVar47 < fVar41 && (bVar38 && bVar37)) {
                              psVar21->ey = fVar41;
                            }
                            psVar21->next = local_3b8.next;
                            local_3b8.next = psVar21;
                          }
                        }
                        fVar39 = p_00[1].y0;
                        p_00 = p_00 + 1;
                      } while (fVar39 <= (float)local_4a0);
                    }
                    local_428 = ppcVar16;
                    if (local_3b8.next != (stbtt__active_edge *)0x0) {
                      local_2a0 = psVar35;
                      psVar17 = local_3b8.next;
                      do {
                        fVar39 = psVar17->fx;
                        fVar42 = psVar17->fdx;
                        if ((fVar42 != 0.0) || (NAN(fVar42))) {
                          fVar46 = fVar42 + fVar39;
                          fVar47 = psVar17->sy;
                          fVar43 = (float)(~-(uint)(fVar41 < fVar47) & (uint)fVar39 |
                                          (uint)((fVar47 - fVar41) * fVar42 + fVar39) &
                                          -(uint)(fVar41 < fVar47));
                          if (0.0 <= fVar43) {
                            fVar40 = psVar17->ey;
                            fVar45 = (float)(-(uint)(fVar40 < (float)local_4a0) &
                                             (uint)((fVar40 - fVar41) * fVar42 + fVar39) |
                                            ~-(uint)(fVar40 < (float)local_4a0) & (uint)fVar46);
                            if (((0.0 <= fVar45) && (fVar43 < local_434)) && (fVar45 < local_434)) {
                              if (fVar47 <= fVar41) {
                                fVar47 = fVar41;
                              }
                              iVar10 = (int)fVar43;
                              if ((float)local_4a0 <= fVar40) {
                                fVar40 = (float)local_4a0;
                              }
                              if (iVar10 == (int)fVar45) {
                                lVar20 = (long)iVar10;
                                *(float *)((long)scanline + lVar20 * 4) =
                                     (((fVar45 - (float)iVar10) + (fVar43 - (float)iVar10)) * -0.5 +
                                     1.0) * psVar17->direction * (fVar40 - fVar47) +
                                     *(float *)((long)scanline + lVar20 * 4);
                                fVar39 = (fVar40 - fVar47) * psVar17->direction;
                              }
                              else {
                                fVar42 = psVar17->fdy;
                                fVar44 = fVar45;
                                if (fVar45 < fVar43) {
                                  fVar39 = fVar41 - fVar47;
                                  fVar47 = (fVar41 - fVar40) + (float)local_4a0;
                                  fVar42 = -fVar42;
                                  fVar40 = fVar39 + (float)local_4a0;
                                  fVar44 = fVar43;
                                  fVar39 = fVar46;
                                  fVar43 = fVar45;
                                }
                                iVar12 = (int)fVar44;
                                iVar10 = (int)fVar43 + 1;
                                fVar45 = ((float)iVar10 - fVar39) * fVar42 + fVar41;
                                fVar39 = psVar17->direction;
                                fVar46 = (fVar45 - fVar47) * fVar39;
                                lVar20 = (long)(int)fVar43;
                                *(float *)((long)scanline + lVar20 * 4) =
                                     (((fVar43 - (float)(int)fVar43) + 1.0) * -0.5 + 1.0) * fVar46 +
                                     *(float *)((long)scanline + lVar20 * 4);
                                if (iVar12 - iVar10 != 0 && iVar10 <= iVar12) {
                                  do {
                                    *(float *)((long)scanline + (lVar20 + 1) * 4) =
                                         fVar42 * fVar39 * 0.5 + fVar46 +
                                         *(float *)((long)scanline + (lVar20 + 1) * 4);
                                    fVar46 = fVar46 + fVar42 * fVar39;
                                    lVar20 = lVar20 + 1;
                                  } while (iVar12 + -1 != (int)lVar20);
                                }
                                lVar20 = (long)iVar12;
                                *(float *)((long)scanline + lVar20 * 4) =
                                     (fVar40 - (fVar42 * (float)(iVar12 - iVar10) + fVar45)) *
                                     (((fVar44 - (float)iVar12) + 0.0) * -0.5 + 1.0) * fVar39 +
                                     fVar46 + *(float *)((long)scanline + lVar20 * 4);
                                fVar39 = (fVar40 - fVar47) * fVar39;
                              }
                              local_308[lVar20] = fVar39 + local_308[lVar20];
                              goto LAB_00135c8e;
                            }
                          }
                          if (0 < (int)uVar27) {
                            local_2f8 = ZEXT416((uint)fVar39);
                            local_408 = ZEXT416((uint)fVar46);
                            uVar11 = 0;
                            local_38c = fVar42;
                            do {
                              local_490 = (float)(int)uVar11;
                              uVar36 = uVar11 + 1;
                              fVar47 = (float)(int)uVar36;
                              fVar42 = (local_490 - fVar39) / local_38c + fVar41;
                              fVar43 = (fVar47 - fVar39) / local_38c + fVar41;
                              local_418._0_4_ = fVar42;
                              if ((local_490 <= fVar39) || (fVar46 <= fVar47)) {
                                if ((fVar46 < local_490) && (fVar47 < fVar39)) {
                                  local_470 = CONCAT44(local_470._4_4_,fVar47);
                                  stbtt__handle_clipped_edge
                                            ((float *)scanline,uVar11,psVar17,fVar39,fVar41,fVar47,
                                             fVar43);
                                  fVar39 = (float)local_470;
                                  fVar41 = fVar43;
                                  fVar42 = (float)local_418._0_4_;
LAB_00135a2d:
                                  stbtt__handle_clipped_edge
                                            ((float *)scanline,uVar11,psVar17,fVar39,fVar41,
                                             local_490,fVar42);
                                  fVar39 = local_490;
                                  fVar41 = (float)local_418._0_4_;
                                  goto LAB_00135a49;
                                }
                                if (((fVar39 < local_490) && (local_490 < fVar46)) ||
                                   ((fVar46 < local_490 && (local_490 < fVar39))))
                                goto LAB_00135a2d;
                                if (((fVar39 < fVar47) && (fVar47 < fVar46)) ||
                                   ((fVar46 < fVar47 && (fVar47 < fVar39)))) {
                                  local_470 = CONCAT44(local_470._4_4_,fVar47);
                                  goto LAB_0013599c;
                                }
                              }
                              else {
                                local_470 = CONCAT44(local_470._4_4_,fVar47);
                                stbtt__handle_clipped_edge
                                          ((float *)scanline,uVar11,psVar17,fVar39,fVar41,local_490,
                                           fVar42);
                                fVar39 = local_490;
                                fVar41 = (float)local_418._0_4_;
                                fVar47 = (float)local_470;
LAB_0013599c:
                                stbtt__handle_clipped_edge
                                          ((float *)scanline,uVar11,psVar17,fVar39,fVar41,fVar47,
                                           fVar43);
                                fVar39 = (float)local_470;
                                fVar41 = fVar43;
LAB_00135a49:
                                fVar46 = (float)local_408._0_4_;
                              }
                              stbtt__handle_clipped_edge
                                        ((float *)scanline,uVar11,psVar17,fVar39,fVar41,fVar46,
                                         (float)local_4a0);
                              fVar41 = local_494;
                              fVar39 = (float)local_2f8._0_4_;
                              fVar46 = (float)local_408._0_4_;
                              uVar11 = uVar36;
                            } while (uVar27 != uVar36);
                          }
                        }
                        else if (fVar39 < local_434) {
                          if (0.0 <= fVar39) {
                            local_2f8 = ZEXT416((uint)fVar39);
                            stbtt__handle_clipped_edge
                                      ((float *)scanline,(int)fVar39,psVar17,fVar39,fVar41,fVar39,
                                       (float)local_4a0);
                            iVar10 = (int)fVar39 + 1;
                            fVar39 = (float)local_2f8._0_4_;
                            fVar41 = local_494;
                          }
                          else {
                            iVar10 = 0;
                          }
                          stbtt__handle_clipped_edge
                                    (local_3c8,iVar10,psVar17,fVar39,fVar41,fVar39,(float)local_4a0)
                          ;
                          fVar41 = local_494;
                        }
LAB_00135c8e:
                        psVar17 = psVar17->next;
                        psVar35 = local_2a0;
                      } while (psVar17 != (stbtt__active_edge *)0x0);
                    }
                    psVar17 = local_3b8.next;
                    if (0 < (int)uVar27) {
                      fVar39 = 0.0;
                      uVar15 = local_2a8 & 0xffffffff;
                      ppcVar16 = scanline;
                      lVar20 = local_2b0;
                      do {
                        fVar39 = fVar39 + *(float *)((long)ppcVar16 + local_2b0 * 4);
                        iVar10 = (int)(ABS(*(float *)ppcVar16 + fVar39) * 255.0 + 0.5);
                        if (0xfe < iVar10) {
                          iVar10 = 0xff;
                        }
                        *(char *)((long)local_318 + (long)(int)uVar15) = (char)iVar10;
                        uVar15 = (ulong)((int)uVar15 + 1);
                        ppcVar16 = (char **)((long)ppcVar16 + 4);
                        lVar20 = lVar20 + -1;
                      } while (lVar20 != 0);
                    }
                    for (; psVar17 != (stbtt__active_edge *)0x0; psVar17 = psVar17->next) {
                      psVar17->fx = psVar17->fdx + psVar17->fx;
                    }
                    uVar15 = (ulong)(local_394 + 1);
                    local_438 = local_438 + 1;
                    uVar14 = (ulong)((int)local_2a8 + uVar27);
                    puVar8 = local_460;
                    ppcVar18 = local_450;
                    ppcVar16 = local_428;
                  } while (local_438 != (int)local_310);
                }
                while (local_450 = ppcVar16, puVar28 = local_460, local_460 = puVar8,
                      local_450 != (char **)0x0) {
                  ppcVar16 = (char **)*local_450;
                  local_488 = (stbtt__active_edge *)0x17c440;
                  pcStack_480 = "stbtt__hheap_cleanup";
                  local_478 = 0x52b3;
                  pcStack_448 = (char *)0x0;
                  local_440 = local_440 & 0xffffffff00000000;
                  (*(code *)in_FS_OFFSET[-0x85])(puVar28,3);
                  puVar8 = local_460;
                  ppcVar18 = local_450;
                  local_460 = puVar28;
                }
                local_450 = ppcVar18;
                if (scanline != &local_238) {
                  local_488 = (stbtt__active_edge *)0x17c440;
                  pcStack_480 = "stbtt__rasterize_sorted_edges";
                  local_478 = 0x54b9;
                  pcStack_448 = (char *)0x0;
                  local_440 = local_440 & 0xffffffff00000000;
                  local_450 = scanline;
                  (*(code *)in_FS_OFFSET[-0x85])(puVar28,3);
                }
                local_238 = 
                "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                ;
                pcStack_230 = "stbtt__rasterize";
                local_228 = 0x5552;
                local_488 = (stbtt__active_edge *)local_3c0;
                pcStack_480 = (char *)0x0;
                local_478 = local_478 & 0xffffffff00000000;
                (*(code *)in_FS_OFFSET[-0x85])(puVar28,3);
                psVar35 = local_458;
              }
              local_238 = 
              "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
              ;
              pcStack_230 = "stbtt_Rasterize";
              local_228 = 0x55f1;
              pcStack_480 = (char *)0x0;
              local_478 = local_478 & 0xffffffff00000000;
              local_488 = psVar35;
              (*(code *)in_FS_OFFSET[-0x85])(puVar28,3);
              local_450 = (char **)0x17c440;
              pcStack_448 = "stbtt_Rasterize";
              local_440 = 0x55f2;
              local_3f0 = local_430;
              pcStack_3e8 = (char *)0x0;
              local_3e0 = local_3e0 & 0xffffffff00000000;
              (*(code *)in_FS_OFFSET[-0x85])(puVar28,3);
            }
          }
          prVar26 = local_3d0;
          puVar28 = local_460;
          pfVar13 = (float *)((long)&local_3d0->field_0 + local_2d0);
          local_238 = 
          "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          pcStack_230 = "stbtt_MakeGlyphBitmapSubpixel";
          local_228 = 0x5638;
          local_488 = (stbtt__active_edge *)local_300;
          pcStack_480 = (char *)0x0;
          local_478 = local_478 & 0xffffffff00000000;
          (*(code *)in_FS_OFFSET[-0x85])(local_460,3);
          if (0.0 < pfVar13[3]) {
            lVar20 = (ulong)(uint)((int)local_2e8 * local_41c + local_464) << 0x20;
            lVar23 = 0;
            do {
              fVar39 = pfVar13[2];
              if (0.0 < fVar39) {
                lVar25 = 1;
                lVar30 = lVar20;
                do {
                  bVar1 = *(byte *)((long)local_318 + lVar25 + -1 + (int)fVar39 * lVar23);
                  bVar31 = bVar1;
                  if (0x50 < bVar1) {
                    bVar31 = 0;
                  }
                  if (antialias != RF_FONT_NO_ANTIALIAS) {
                    bVar31 = bVar1;
                  }
                  *(undefined1 *)((long)dst + (lVar30 >> 0x1f)) = 0xff;
                  *(byte *)((long)dst + (lVar30 >> 0x1f) + 1) = bVar31;
                  fVar41 = (float)lVar25;
                  fVar39 = pfVar13[2];
                  lVar25 = lVar25 + 1;
                  lVar30 = lVar30 + 0x100000000;
                } while (fVar41 < fVar39);
              }
              lVar23 = lVar23 + 1;
              lVar20 = lVar20 + local_2e0;
            } while ((float)lVar23 < pfVar13[3]);
          }
          *pfVar13 = (float)local_464;
          pfVar13[1] = (float)local_41c;
          fVar39 = pfVar13[2] + local_3b8.ey + (float)local_464;
          in_XMM2_Da = (local_3b8.sy - pfVar13[2]) - local_3b8.ey;
          if (in_XMM2_Da <= (float)(int)fVar39) {
            local_464 = (int)local_328;
            iVar12 = local_3d8->font_size + local_464;
            iVar10 = local_41c + iVar12;
            bVar37 = local_398 - iVar12 < iVar10;
          }
          else {
            local_464 = (int)fVar39;
            bVar37 = false;
            iVar10 = local_41c;
          }
          local_298 = local_318;
          atlas_width = local_398;
        } while ((!bVar37) &&
                (lVar20 = local_2c8 + 1, in_XMM3_Da = local_3b8.ey, lVar20 != local_330));
      }
      *puVar28 = 0;
      puVar28[1] = 0;
      local_338->data = dst;
      local_338->width = atlas_width;
      local_338->height = atlas_width;
      local_338->format = RF_UNCOMPRESSED_GRAY_ALPHA;
      local_338->valid = true;
    }
    local_280 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_278 = "rf_generate_ttf_font_atlas";
    local_270 = 0x5c05;
    uStack_290 = 0;
    local_288 = 0;
    rVar5.proc_name._0_4_ = 0x17d59b;
    rVar5.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar5.proc_name._4_4_ = 0;
    rVar5.line_in_file = 0x5c05;
    rVar6.size_to_allocate_or_reallocate = 0;
    rVar6.pointer_to_free_or_realloc = local_298;
    rVar6._16_8_ = (ulong)uStack_284 << 0x20;
    (*temp_allocator.allocator_proc)(&temp_allocator,rVar5,RF_AM_FREE,rVar6);
    __return_storage_ptr__ = local_338;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_generate_ttf_font_atlas(rf_ttf_font_info* font_info, int atlas_width, int padding, rf_glyph_info* glyphs, rf_int glyphs_count, rf_font_antialias antialias, unsigned short* dst, rf_int dst_count, rf_allocator temp_allocator)
{
    rf_image result = {0};

    if (font_info && font_info->valid)
    {
        int atlas_pixel_count = atlas_width * atlas_width;

        if (dst && dst_count >= atlas_pixel_count)
        {
            memset(dst, 0, atlas_pixel_count * 2);

            int largest_glyph_size = 0;
            for (rf_int i = 0; i < glyphs_count; i++)
            {
                int area = glyphs[i].width * glyphs[i].height;
                if (area > largest_glyph_size)
                {
                    largest_glyph_size = area;
                }
            }

            // Allocate a grayscale buffer large enough to store the largest glyph
            unsigned char* glyph_buffer = RF_ALLOC(temp_allocator, largest_glyph_size);

            // Use basic packing algorithm to generate the atlas
            if (glyph_buffer)
            {
                // We update these for every pixel in the loop
                int offset_x = RF_BUILTIN_FONT_PADDING;
                int offset_y = RF_BUILTIN_FONT_PADDING;

                // Set the allocator for stbtt
                RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
                {
                    // Using simple packaging, one char after another
                    for (rf_int i = 0; i < glyphs_count; i++)
                    {
                        // Extract these variables to shorter names
                        stbtt_fontinfo* stbtt_ctx = (stbtt_fontinfo*) &font_info->internal_stb_font_info;

                        // Get glyph bitmap
                        stbtt_MakeCodepointBitmap(stbtt_ctx, glyph_buffer, glyphs[i].width, glyphs[i].height, glyphs[i].width, font_info->scale_factor, font_info->scale_factor, glyphs[i].codepoint);

                        // Copy pixel data from fc.data to atlas
                        for (rf_int y = 0; y < glyphs[i].height; y++)
                        {
                            for (rf_int x = 0; x < glyphs[i].width; x++)
                            {
                                unsigned char glyph_pixel = glyph_buffer[y * ((int)glyphs[i].width) + x];
                                if (antialias == RF_FONT_NO_ANTIALIAS && glyph_pixel > RF_BITMAP_ALPHA_THRESHOLD) glyph_pixel = 0;

                                int dst_index = (offset_y + y) * atlas_width + (offset_x + x);
                                // dst is in RF_UNCOMPRESSED_GRAY_ALPHA which is 2 bytes
                                // for fonts we write the glyph_pixel in the alpha channel which is byte 2
                                ((unsigned char*)(&dst[dst_index]))[0] = 255;
                                ((unsigned char*)(&dst[dst_index]))[1] = glyph_pixel;
                            }
                        }

                        // Fill chars rectangles in atlas info
                        glyphs[i].x = (float)offset_x;
                        glyphs[i].y = (float)offset_y;

                        // Move atlas position X for next character drawing
                        offset_x += (glyphs[i].width + 2 * padding);
                        if (offset_x >= (atlas_width - glyphs[i].width - 2 * padding))
                        {
                            offset_x  = padding;
                            offset_y += font_info->font_size + padding;

                            if (offset_y > (atlas_width - font_info->font_size - padding)) break;
                            //else error dst buffer is not big enough
                        }
                    }
                }
                RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

                result.data   = dst;
                result.width  = atlas_width;
                result.height = atlas_width;
                result.format = RF_UNCOMPRESSED_GRAY_ALPHA;
                result.valid  = true;
            }

            RF_FREE(temp_allocator, glyph_buffer);
        }
    }

    return result;
}